

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes-tests.cpp
# Opt level: O1

void check<std::multimap<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
               (unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> *db,
               multimap<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *v)

{
  IDatabase *pIVar1;
  size_t sVar2;
  size_t sVar3;
  AssertionHandler catchAssertionHandler;
  string k;
  EncodedValue ev;
  EncodedValue evr;
  undefined8 local_228;
  size_t local_220;
  AssertionHandler local_218;
  SourceLineInfo local_1d0;
  ITransientExpression local_1c0;
  size_t *local_1b0;
  char *local_1a8;
  size_t sStack_1a0;
  size_t *local_198;
  long *local_190;
  long local_188;
  long local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  EncodedValue local_130;
  undefined1 local_f0 [8];
  HashedValue local_e8;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_190 = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"testkey","");
  groundupdb::EncodedValue::
  EncodedValue<std::multimap<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>,void>
            (&local_130,v);
  pIVar1 = (db->_M_t).
           super___uniq_ptr_impl<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::IDatabase_*,_std::default_delete<groundupdb::IDatabase>_>
           .super__Head_base<0UL,_groundupdb::IDatabase_*,_false>._M_head_impl;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,local_190,local_188 + (long)local_190);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>((HashedValue *)&local_218,&local_150);
  (*pIVar1->_vptr_IDatabase[3])(pIVar1,&local_218,&local_130);
  local_218.m_assertionInfo.macroName.m_start = (char *)&PTR__HashedValue_001d4818;
  if (local_218.m_assertionInfo.lineInfo.file != (char *)0x0) {
    operator_delete(local_218.m_assertionInfo.lineInfo.file,
                    (long)local_218.m_assertionInfo.capturedExpression.m_start -
                    (long)local_218.m_assertionInfo.lineInfo.file);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  pIVar1 = (db->_M_t).
           super___uniq_ptr_impl<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_groundupdb::IDatabase_*,_std::default_delete<groundupdb::IDatabase>_>
           .super__Head_base<0UL,_groundupdb::IDatabase_*,_false>._M_head_impl;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_190,local_188 + (long)local_190);
  groundupdb::HashedValue::HashedValue<std::__cxx11::string>((HashedValue *)&local_218,&local_170);
  (*pIVar1->_vptr_IDatabase[5])(local_f0,pIVar1,&local_218);
  local_218.m_assertionInfo.macroName.m_start = (char *)&PTR__HashedValue_001d4818;
  if (local_218.m_assertionInfo.lineInfo.file != (char *)0x0) {
    operator_delete(local_218.m_assertionInfo.lineInfo.file,
                    (long)local_218.m_assertionInfo.capturedExpression.m_start -
                    (long)local_218.m_assertionInfo.lineInfo.file);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x3f;
  Catch::StringRef::StringRef(&local_40,"ev.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_40,Normal);
  local_1c0._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_1c0._vptr_ITransientExpression._1_7_,local_130.m_has_value);
  Catch::AssertionHandler::handleExpr<bool>(&local_218,(ExprLhs<bool> *)&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x40;
  Catch::StringRef::StringRef(&local_50,"evr.hasValue()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_50,Normal);
  local_1c0._vptr_ITransientExpression =
       (_func_int **)CONCAT71(local_1c0._vptr_ITransientExpression._1_7_,local_f0[0]);
  Catch::AssertionHandler::handleExpr<bool>(&local_218,(ExprLhs<bool> *)&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x41;
  Catch::StringRef::StringRef(&local_60,"0 != ev.hash()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_60,Normal);
  local_228 = (ulong)local_228._4_4_ << 0x20;
  sVar2 = groundupdb::HashedValue::hash(&local_130.m_value);
  sVar3 = (size_t)(int)local_228;
  local_220 = sVar2;
  Catch::StringRef::StringRef((StringRef *)&local_1d0,"!=");
  local_1c0.m_result = sVar2 != sVar3;
  local_1c0.m_isBinaryExpression = true;
  local_1c0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d47d8;
  local_1a8 = local_1d0.file;
  sStack_1a0 = local_1d0.line;
  local_1b0 = &local_228;
  local_198 = &local_220;
  Catch::AssertionHandler::handleExpr(&local_218,&local_1c0);
  Catch::ITransientExpression::~ITransientExpression(&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x42;
  Catch::StringRef::StringRef(&local_70,"0 != evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_70,Normal);
  local_228 = local_228 & 0xffffffff00000000;
  sVar2 = groundupdb::HashedValue::hash(&local_e8);
  sVar3 = (size_t)(int)local_228;
  local_220 = sVar2;
  Catch::StringRef::StringRef((StringRef *)&local_1d0,"!=");
  local_1c0.m_result = sVar2 != sVar3;
  local_1c0.m_isBinaryExpression = true;
  local_1c0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d47d8;
  local_1a8 = local_1d0.file;
  sStack_1a0 = local_1d0.line;
  local_1b0 = &local_228;
  local_198 = &local_220;
  Catch::AssertionHandler::handleExpr(&local_218,&local_1c0);
  Catch::ITransientExpression::~ITransientExpression(&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x43;
  Catch::StringRef::StringRef(&local_80,"ev.hash() == evr.hash()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_80,Normal);
  local_220 = groundupdb::HashedValue::hash(&local_130.m_value);
  sVar3 = groundupdb::HashedValue::hash(&local_e8);
  sVar2 = local_220;
  local_228 = sVar3;
  Catch::StringRef::StringRef((StringRef *)&local_1d0,"==");
  local_1c0.m_result = sVar2 == sVar3;
  local_1c0.m_isBinaryExpression = true;
  local_1c0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d4728;
  local_1a8 = local_1d0.file;
  sStack_1a0 = local_1d0.line;
  local_1b0 = &local_220;
  local_198 = &local_228;
  Catch::AssertionHandler::handleExpr(&local_218,&local_1c0);
  Catch::ITransientExpression::~ITransientExpression(&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x44;
  Catch::StringRef::StringRef(&local_90,"0 != ev.length()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_90,Normal);
  local_228 = local_228 & 0xffffffff00000000;
  sVar2 = groundupdb::HashedValue::length(&local_130.m_value);
  sVar3 = (size_t)(int)local_228;
  local_220 = sVar2;
  Catch::StringRef::StringRef((StringRef *)&local_1d0,"!=");
  local_1c0.m_result = sVar2 != sVar3;
  local_1c0.m_isBinaryExpression = true;
  local_1c0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d47d8;
  local_1a8 = local_1d0.file;
  sStack_1a0 = local_1d0.line;
  local_1b0 = &local_228;
  local_198 = &local_220;
  Catch::AssertionHandler::handleExpr(&local_218,&local_1c0);
  Catch::ITransientExpression::~ITransientExpression(&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x45;
  Catch::StringRef::StringRef(&local_a0,"0 != evr.length()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_a0,Normal);
  local_228 = local_228 & 0xffffffff00000000;
  sVar2 = groundupdb::HashedValue::length(&local_e8);
  sVar3 = (size_t)(int)local_228;
  local_220 = sVar2;
  Catch::StringRef::StringRef((StringRef *)&local_1d0,"!=");
  local_1c0.m_result = sVar2 != sVar3;
  local_1c0.m_isBinaryExpression = true;
  local_1c0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d47d8;
  local_1a8 = local_1d0.file;
  sStack_1a0 = local_1d0.line;
  local_1b0 = &local_228;
  local_198 = &local_220;
  Catch::AssertionHandler::handleExpr(&local_218,&local_1c0);
  Catch::ITransientExpression::~ITransientExpression(&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_1c0._vptr_ITransientExpression = (_func_int **)0x1a00f6;
  local_1c0.m_isBinaryExpression = true;
  local_1c0.m_result = false;
  local_1c0._10_6_ = 0;
  local_1d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/adamfowleruk[P]groundupdb/groundupdb-tests/datatypes-tests.cpp"
  ;
  local_1d0.line = 0x46;
  Catch::StringRef::StringRef(&local_b0,"ev.length() == evr.length()");
  Catch::AssertionHandler::AssertionHandler
            (&local_218,(StringRef *)&local_1c0,&local_1d0,local_b0,Normal);
  local_220 = groundupdb::HashedValue::length(&local_130.m_value);
  sVar3 = groundupdb::HashedValue::length(&local_e8);
  sVar2 = local_220;
  local_228 = sVar3;
  Catch::StringRef::StringRef((StringRef *)&local_1d0,"==");
  local_1c0.m_result = sVar2 == sVar3;
  local_1c0.m_isBinaryExpression = true;
  local_1c0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d4728;
  local_1a8 = local_1d0.file;
  sStack_1a0 = local_1d0.line;
  local_1b0 = &local_220;
  local_198 = &local_228;
  Catch::AssertionHandler::handleExpr(&local_218,&local_1c0);
  Catch::ITransientExpression::~ITransientExpression(&local_1c0);
  Catch::AssertionHandler::complete(&local_218);
  if (local_218.m_completed == false) {
    (*(local_218.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_e8._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d4818;
  if (local_e8.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_130.m_value._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d4818;
  if (local_130.m_value.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.m_value.m_data.
                    super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.m_value.m_data.
                          super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.m_value.m_data.
                          super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_190 != local_180) {
    operator_delete(local_190,local_180[0] + 1);
  }
  return;
}

Assistant:

void check(const std::unique_ptr<groundupdb::IDatabase> &db, T v) {
  std::string k("testkey");
  groundupdb::EncodedValue ev(v);
  db->setKeyValue(k, std::move(ev));
  groundupdb::EncodedValue evr = db->getKeyValue(k);
  REQUIRE(ev.hasValue());
  REQUIRE(evr.hasValue());
  REQUIRE(0 != ev.hash());
  REQUIRE(0 != evr.hash());
  REQUIRE(ev.hash() == evr.hash());
  REQUIRE(0 != ev.length());
  REQUIRE(0 != evr.length());
  REQUIRE(ev.length() == evr.length());
}